

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadCastServer.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined8 uVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  WrapTcpService *__tmp;
  EventLoop *this_01;
  bool bVar8;
  PTR listenThrean;
  long *local_a8 [2];
  long local_98 [2];
  undefined8 local_88;
  long local_80;
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  
  if (argc == 2) {
    iVar2 = atoi(argv[1]);
    brynet::net::base::InitSocket();
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Var3->_M_use_count = 1;
    p_Var3->_M_weak_count = 1;
    p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00108c60;
    this = p_Var3 + 1;
    brynet::net::WrapTcpService::WrapTcpService((WrapTcpService *)this);
    this_00 = service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    bVar8 = service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var3;
    if (bVar8) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    puVar4 = (undefined8 *)operator_new(0xe0);
    puVar4[1] = 0x100000001;
    *puVar4 = &PTR___Sp_counted_ptr_inplace_00108cd8;
    this_01 = (EventLoop *)(puVar4 + 2);
    brynet::net::EventLoop::EventLoop(this_01);
    brynet::net::ListenThread::Create();
    uVar1 = local_88;
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"0.0.0.0","");
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(puVar4 + 1) = *(int *)(puVar4 + 1) + 1;
      UNLOCK();
    }
    else {
      *(int *)(puVar4 + 1) = *(int *)(puVar4 + 1) + 1;
    }
    if (local_80 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_80 + 8) = *(int *)(local_80 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_80 + 8) = *(int *)(local_80 + 8) + 1;
      }
    }
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78 = (undefined8 *)0x0;
    uStack_70 = 0;
    local_78 = (undefined8 *)operator_new(0x20);
    *local_78 = this_01;
    local_78[1] = puVar4;
    local_78[2] = local_88;
    local_78[3] = local_80;
    pcStack_60 = std::
                 _Function_handler<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/examples/BroadCastServer.cpp:83:55)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/examples/BroadCastServer.cpp:83:55)>
               ::_M_manager;
    brynet::net::ListenThread::startListen(uVar1,0,local_a8,iVar2);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0],local_98[0] + 1);
    }
    local_58 = 0;
    uStack_50 = 0;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    brynet::net::WrapTcpService::startWorkThread
              (service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,2);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    do {
      lVar5 = std::chrono::_V2::steady_clock::now();
      do {
        brynet::net::EventLoop::loop((long)this_01);
        lVar6 = std::chrono::_V2::steady_clock::now();
      } while (lVar6 - lVar5 < 1000000000);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cost ",5);
      poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ms, clientnum:",0xf);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", recv",6);
      poVar7 = std::ostream::_M_insert<long_long>((longlong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," K/s, ",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"num : ",6);
      poVar7 = std::ostream::_M_insert<long_long>((longlong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", send ",7);
      poVar7 = std::ostream::_M_insert<long_long>((longlong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," M/s, ",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," num: ",6);
      poVar7 = std::ostream::_M_insert<long_long>((longlong)poVar7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      LOCK();
      TotalRecvLen.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      TotalSendLen.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      RecvPacketNum.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      SendPacketNum.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
    } while( true );
  }
  fwrite("Usage : <listen port> \n",0x17,1,_stderr);
  exit(-1);
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage : <listen port> \n");
        exit(-1);
    }

    int port = atoi(argv[1]);
    brynet::net::base::InitSocket();

    service = std::make_shared<WrapTcpService>();
    auto mainLoop = std::make_shared<EventLoop>();
    auto listenThrean = ListenThread::Create();

    listenThrean->startListen(false, "0.0.0.0", port, [mainLoop, listenThrean](TcpSocket::PTR socket) {
        socket->SocketNodelay();
        socket->SetSendSize(32 * 1024);
        socket->SetRecvSize(32 * 1024);

        auto enterCallback = [mainLoop](const TCPSession::PTR& session) {
            mainLoop->pushAsyncProc([session]() {
                addClientID(session);
            });

            session->setDisConnectCallback([mainLoop](const TCPSession::PTR& session) {
                mainLoop->pushAsyncProc([session]() {
                    removeClientID(session);
                });
            });

            session->setDataCallback([mainLoop](const TCPSession::PTR& session, const char* buffer, size_t len) {
                const char* parseStr = buffer;
                size_t totalProcLen = 0;
                size_t leftLen = len;

                while (true)
                {
                    bool flag = false;
                    auto HEAD_LEN = sizeof(uint32_t) + sizeof(uint16_t);
                    if (leftLen >= HEAD_LEN)
                    {
                        BasePacketReader rp(parseStr, leftLen);
                        auto packet_len = rp.readUINT32();
                        if (leftLen >= packet_len && packet_len >= HEAD_LEN)
                        {
                            auto packet = DataSocket::makePacket(parseStr, packet_len);
                            mainLoop->pushAsyncProc([packet]() {
                                broadCastPacket(packet);
                            });

                            totalProcLen += packet_len;
                            parseStr += packet_len;
                            leftLen -= packet_len;
                            flag = true;
                        }
                        rp.skipAll();
                    }

                    if (!flag)
                    {
                        break;
                    }
                }

                return totalProcLen;
            });
        };
        service->addSession(std::move(socket),
            AddSessionOption::WithEnterCallback(enterCallback),
            AddSessionOption::WithMaxRecvBufferSize(1024 * 1024));
    });

    service->startWorkThread(2);

    auto now = std::chrono::steady_clock::now();
    while (true)
    {
        mainLoop->loop(10);
        auto diff = std::chrono::steady_clock::now() - now;
        if (diff >= std::chrono::seconds(1))
        {
            auto msDiff = std::chrono::duration_cast<std::chrono::milliseconds>(diff).count();
            std::cout << "cost " << 
                msDiff << " ms, clientnum:" << 
                getClientNum() << ", recv" <<
                (TotalRecvLen / 1024) * 1000 / msDiff  << 
                " K/s, " << "num : " << 
                RecvPacketNum * 1000 / msDiff << ", send " <<
                (TotalSendLen / 1024) / 1024 * 1000 / msDiff <<
                " M/s, " << " num: " << 
                SendPacketNum * 1000 / msDiff << std::endl;
            TotalRecvLen = 0;
            TotalSendLen = 0;
            RecvPacketNum = 0;
            SendPacketNum = 0;
            now = std::chrono::steady_clock::now();
        }
    }

    service->stopWorkThread();

    return 0;
}